

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  SecondaryAllocator *pSVar1;
  PageAllocatorBaseCommon *pPVar2;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  int iVar8;
  BVIndex BVar9;
  uint uVar10;
  BOOL BVar11;
  undefined4 *puVar12;
  char *lpAddress;
  HANDLE pVVar13;
  AllocatorType *pAVar14;
  uintptr_t mask;
  DWORD local_40;
  BVIndex local_3c;
  DWORD oldProtect;
  
  BVar9 = this->freePageCount;
  if (BVar9 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar5) goto LAB_00705709;
    *puVar12 = 0;
    BVar9 = this->freePageCount;
  }
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar9 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00705709;
    *puVar12 = 0;
  }
  if (this->freePageCount < pageCount) {
    return (char *)0x0;
  }
  if ((this->freePageCount == 0 && this->decommitPageCount == 0) ||
     ((pSVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator,
      pSVar1 != (SecondaryAllocator *)0x0 &&
      (iVar8 = (*pSVar1->_vptr_SecondaryAllocator[3])(), (char)iVar8 == '\0')))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x158,"(!IsFull())","!IsFull()");
    if (!bVar5) goto LAB_00705709;
    *puVar12 = 0;
  }
  BVar9 = BVStatic<272UL>::GetNextBit(this_00,0);
  if (BVar9 == 0xffffffff) {
    return (char *)0x0;
  }
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  _oldProtect = (char *)0x0;
  local_3c = BVar9;
  while( true ) {
    pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
             allocator;
    pAVar14 = &pPVar2[-1].allocatorType;
    if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
      pAVar14 = (AllocatorType *)0x0;
    }
    if (pAVar14[0x28] <= BVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                         "index < this->GetAllocator()->GetMaxAllocPageCount()");
      if (!bVar5) goto LAB_00705709;
      *puVar12 = 0;
    }
    uVar10 = GetAvailablePageCount(this);
    if (uVar10 - BVar9 < pageCount) {
      return _oldProtect;
    }
    if (pageCount == 1) break;
    BVar6 = BVStatic<272UL>::TestRange(this_00,BVar9,pageCount);
    if (BVar6 == '\0') {
      BVar9 = BVar9 + 1;
    }
    else {
      lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar9 << 0xc);
      if ((pageCount == 0) || (((ulong)pageCount * 0x1000 - 1 & (ulong)lpAddress) == 0))
      goto LAB_007055ae;
      BVar9 = BVar9 + (int)((ulong)lpAddress % ((ulong)pageCount * 0x1000) >> 0xc);
      pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar14 = &pPVar2[-1].allocatorType;
      if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
        pAVar14 = (AllocatorType *)0x0;
      }
      if (pAVar14[0x28] <= BVar9) {
        return _oldProtect;
      }
    }
    BVar9 = BVStatic<272UL>::GetNextBit(this_00,BVar9);
    if (BVar9 == 0xffffffff) {
      return _oldProtect;
    }
  }
  lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (local_3c << 0xc);
  BVar9 = local_3c;
LAB_007055ae:
  BVStatic<272UL>::ClearRange(this_00,BVar9,pageCount);
  BVar7 = this->freePageCount - pageCount;
  this->freePageCount = BVar7;
  BVar9 = BVStatic<272UL>::Count(this_00);
  if (BVar7 != BVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00705709;
    *puVar12 = 0;
  }
  pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar14 = &pPVar2[-1].allocatorType;
  if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
    pAVar14 = (AllocatorType *)0x0;
  }
  pVVar3 = *(HANDLE *)(pAVar14 + 0x4a);
  pVVar13 = GetCurrentProcess();
  if (pVVar3 != pVVar13) {
    return lpAddress;
  }
  BVar11 = VirtualProtect(lpAddress,(ulong)(pageCount << 0xc),4,&local_40);
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x180,"((0))","UNREACHED");
    if (bVar5) {
      *puVar12 = 0;
      return (char *)0x0;
    }
  }
  else {
    if (local_40 == 1) {
      return lpAddress;
    }
    AssertCount = AssertCount + 1;
    _oldProtect = lpAddress;
    Js::Throw::LogAssert();
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
    if (bVar5) {
      *puVar12 = 0;
      return _oldProtect;
    }
  }
LAB_00705709:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}